

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O3

void cf_he_close(Curl_cfilter *cf,Curl_easy *data)

{
  Curl_cfilter *pCVar1;
  curl_trc_feat *pcVar2;
  Curl_cfilter *cf_00;
  
  pCVar1 = (Curl_cfilter *)cf->ctx;
  cf_00 = pCVar1;
  if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
      ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))) &&
     (0 < cf->cft->log_level)) {
    Curl_trc_cf_infof(data,cf,"close");
    cf_00 = (Curl_cfilter *)cf->ctx;
  }
  cf_he_ctx_clear(cf_00,data);
  cf->field_0x24 = cf->field_0x24 & 0xfe;
  *(undefined4 *)&pCVar1->conn = 0;
  pCVar1 = cf->next;
  if (pCVar1 != (Curl_cfilter *)0x0) {
    (*(code *)pCVar1->cft->do_close)(pCVar1,data);
    Curl_conn_cf_discard_chain(&cf->next,data);
    return;
  }
  return;
}

Assistant:

static void cf_he_close(struct Curl_cfilter *cf,
                        struct Curl_easy *data)
{
  struct cf_he_ctx *ctx = cf->ctx;

  CURL_TRC_CF(data, cf, "close");
  cf_he_ctx_clear(cf, data);
  cf->connected = FALSE;
  ctx->state = SCFST_INIT;

  if(cf->next) {
    cf->next->cft->do_close(cf->next, data);
    Curl_conn_cf_discard_chain(&cf->next, data);
  }
}